

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O1

void __thiscall GoState<5U,_4U>::GoState(GoState<5U,_4U> *this,char (*board) [5])

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  int j;
  ulong uVar3;
  int i;
  ulong uVar4;
  GoState<5U,_4U> state;
  GoState<5U,_4U> local_88;
  
  this->_vptr_GoState = (_func_int **)&PTR__GoState_00162918;
  this->previous_board_hash_value = 0;
  p_Var1 = &(this->all_hash_values)._M_t._M_impl.super__Rb_tree_header;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->depth = 0;
  this->player_to_move = 1;
  GoState(&local_88);
  uVar4 = 0;
  do {
    uVar3 = 0;
    do {
      bVar2 = ((*board)[uVar3] == '2') * '\x02';
      if ((*board)[uVar3] == '1') {
        bVar2 = 1;
      }
      (*this->_vptr_GoState[3])(this,uVar4 & 0xffffffff,uVar3 & 0xffffffff,(ulong)bVar2);
      uVar3 = uVar3 + 1;
    } while (uVar3 != 4);
    uVar4 = uVar4 + 1;
    board = board + 1;
  } while (uVar4 != 5);
  local_88._vptr_GoState = (_func_int **)&PTR__GoState_00162918;
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_88.all_hash_values._M_t);
  return;
}

Assistant:

GoState(char board[M][N+1]):
		previous_board_hash_value(0),
		depth(0),
		player_to_move(1)
	{
		GoState<M, N> state;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			if (board[i][j] == '1') {
				set_pos(i, j, 1);
			}
			else if (board[i][j] == '2') {
				set_pos(i, j, 2);
			}
			else {
				set_pos(i, j, empty);
			}
		}}
	}